

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O2

sptr __thiscall AStarFringe::extractFromFringe(AStarFringe *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  sptr sVar1;
  Node top;
  Node NStack_28;
  
  if (*(Node **)(in_RSI + 0x38) == *(Node **)(in_RSI + 0x40)) {
    (this->super_Fringe)._vptr_Fringe = (_func_int **)0x0;
    *(undefined8 *)&(this->super_Fringe).fringeSet._M_t._M_impl = 0;
  }
  else {
    Node::Node(&NStack_28,*(Node **)(in_RSI + 0x38));
    std::
    priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
    ::pop((priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
           *)(in_RSI + 0x38));
    std::__shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2> *)&NStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&NStack_28.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar1.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar1.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (sptr)sVar1.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SearchNode::sptr AStarFringe::extractFromFringe() {
    if (fringe.empty()) {
        return nullptr;
    }

    Node top = fringe.top();
    fringe.pop();

    return top.node;
}